

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

opj_image_t *
rawtoimage_common(char *filename,opj_cparameters_t *parameters,raw_cparameters_t *raw_cp,
                 OPJ_BOOL big_endian)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  OPJ_BOOL OVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  raw_comp_cparameters_t *prVar9;
  ulong uVar10;
  byte *pbVar11;
  FILE *pFVar12;
  int iVar13;
  int *__ptr;
  opj_image_t *poVar14;
  size_t sVar15;
  byte *pbVar16;
  ulong uVar17;
  opj_cparameters_t *poVar18;
  opj_cparameters_t *poVar19;
  int *piVar20;
  int iVar21;
  uchar value;
  uchar temp2;
  uchar temp1;
  unsigned_short ch;
  byte local_71;
  raw_cparameters_t *local_70;
  FILE *local_68;
  byte local_5a;
  byte local_59;
  ulong local_58;
  opj_image_t *local_50;
  opj_cparameters_t *local_48;
  OPJ_BOOL local_40;
  undefined1 local_3a [2];
  opj_cparameters_t *local_38;
  
  local_70 = raw_cp;
  local_40 = big_endian;
  if ((raw_cp->rawBitDepth & raw_cp->rawHeight & raw_cp->rawWidth & raw_cp->rawComp) == 0) {
    iVar13 = parameters->subsampling_dx;
    iVar1 = parameters->subsampling_dy;
    local_68 = fopen(filename,"rb");
    if (local_68 == (FILE *)0x0) {
      rawtoimage_common_cold_6();
    }
    else {
      uVar2 = local_70->rawComp;
      poVar19 = (opj_cparameters_t *)(ulong)uVar2;
      iVar21 = 2;
      if ((poVar19 != (opj_cparameters_t *)0x1) && (iVar21 = -1, 2 < (int)uVar2)) {
        iVar21 = 3;
        if (parameters->tcp_mct != '\0') {
          iVar21 = (uint)(parameters->tcp_mct != '\x02') * 2 + -1;
        }
      }
      iVar3 = local_70->rawWidth;
      uVar4 = local_70->rawHeight;
      local_48 = parameters;
      __ptr = (int *)calloc((size_t)poVar19,0x24);
      if (__ptr == (int *)0x0) {
        rawtoimage_common_cold_5();
      }
      else {
        if (0 < (int)uVar2) {
          iVar5 = local_70->rawBitDepth;
          OVar6 = local_70->rawSigned;
          prVar9 = local_70->rawComps;
          poVar18 = (opj_cparameters_t *)0x0;
          piVar20 = __ptr;
          do {
            piVar20[6] = iVar5;
            piVar20[8] = OVar6;
            *piVar20 = prVar9[(long)poVar18].dx * iVar13;
            piVar20[1] = prVar9[(long)poVar18].dy * iVar1;
            piVar20[2] = iVar3;
            piVar20[3] = uVar4;
            poVar18 = (opj_cparameters_t *)((long)&poVar18->tile_size_on + 1);
            piVar20 = piVar20 + 9;
          } while (poVar19 != poVar18);
        }
        local_58 = (ulong)uVar4;
        poVar14 = (opj_image_t *)opj_image_create(uVar2,__ptr,iVar21);
        free(__ptr);
        pFVar12 = local_68;
        if (poVar14 != (opj_image_t *)0x0) {
          OVar7 = local_48->image_offset_x0;
          poVar14->x0 = OVar7;
          OVar8 = local_48->image_offset_y0;
          poVar14->y0 = OVar8;
          poVar14->x1 = OVar7 + (iVar3 + -1) * iVar13 + 1;
          iVar13 = (int)local_58;
          poVar14->y1 = (iVar13 + -1) * iVar1 + OVar8 + 1;
          local_50 = poVar14;
          local_48 = poVar19;
          if (local_70->rawBitDepth < 9) {
            local_71 = 0;
            if (0 < (int)uVar2) {
              poVar19 = (opj_cparameters_t *)0x0;
              do {
                uVar10 = (long)(iVar13 * iVar3) /
                         (long)(local_70->rawComps[(long)poVar19].dy *
                               local_70->rawComps[(long)poVar19].dx);
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    sVar15 = fread(&local_71,1,1,local_68);
                    if (sVar15 == 0) {
                      rawtoimage_common_cold_4();
                      return (opj_image_t *)0x0;
                    }
                    uVar2 = (int)(char)local_71;
                    if (local_70->rawSigned == 0) {
                      uVar2 = (uint)local_71;
                    }
                    local_50->comps[(long)poVar19].data[uVar17] = uVar2;
                    uVar17 = uVar17 + 1;
                  } while ((uVar10 & 0xffffffff) != uVar17);
                }
                poVar19 = (opj_cparameters_t *)((long)&poVar19->tile_size_on + 1);
              } while (poVar19 != local_48);
            }
          }
          else {
            if (0x10 < local_70->rawBitDepth) {
              rawtoimage_common_cold_2();
              return (opj_image_t *)0x0;
            }
            if (0 < (int)uVar2) {
              local_58 = (ulong)(uint)(iVar13 * iVar3);
              poVar19 = (opj_cparameters_t *)0x0;
              do {
                uVar10 = (long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 | local_58 & 0xffffffff
                               ) / (long)(local_70->rawComps[(long)poVar19].dy *
                                         local_70->rawComps[(long)poVar19].dx);
                local_38 = poVar19;
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    sVar15 = fread(&local_59,1,1,pFVar12);
                    if ((sVar15 == 0) || (sVar15 = fread(&local_5a,1,1,pFVar12), sVar15 == 0)) {
                      fwrite("Error reading raw file. End of file probably reached.\n",0x36,1,
                             _stderr);
                      opj_image_destroy(local_50);
                      goto LAB_00109e48;
                    }
                    pbVar16 = &local_59;
                    pbVar11 = &local_5a;
                    if (local_40 == 0) {
                      pbVar16 = &local_5a;
                      pbVar11 = &local_59;
                    }
                    uVar2 = (uint)*pbVar16 << 8;
                    if (local_70->rawSigned != 0) {
                      uVar2 = (int)(short)((ushort)*pbVar16 << 8);
                    }
                    local_50->comps[(long)poVar19].data[uVar17] = uVar2 | *pbVar11;
                    uVar17 = uVar17 + 1;
                  } while ((uVar10 & 0xffffffff) != uVar17);
                }
                poVar19 = (opj_cparameters_t *)((long)&local_38->tile_size_on + 1);
              } while (poVar19 != local_48);
            }
          }
          pFVar12 = local_68;
          sVar15 = fread(local_3a,1,1,local_68);
          if (sVar15 != 0) {
            rawtoimage_common_cold_3();
          }
          fclose(pFVar12);
          return local_50;
        }
LAB_00109e48:
        fclose(pFVar12);
      }
    }
  }
  else {
    rawtoimage_common_cold_1();
  }
  return (opj_image_t *)0x0;
}

Assistant:

static opj_image_t* rawtoimage_common(const char *filename,
                                      opj_cparameters_t *parameters, raw_cparameters_t *raw_cp, OPJ_BOOL big_endian)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *f = NULL;
    int i, compno, numcomps, w, h;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t *cmptparm;
    opj_image_t * image = NULL;
    unsigned short ch;

    if ((!(raw_cp->rawWidth & raw_cp->rawHeight & raw_cp->rawComp &
            raw_cp->rawBitDepth)) == 0) {
        fprintf(stderr, "\nError: invalid raw image parameters\n");
        fprintf(stderr, "Please use the Format option -F:\n");
        fprintf(stderr,
                "-F <width>,<height>,<ncomp>,<bitdepth>,{s,u}@<dx1>x<dy1>:...:<dxn>x<dyn>\n");
        fprintf(stderr,
                "If subsampling is omitted, 1x1 is assumed for all components\n");
        fprintf(stderr,
                "Example: -i image.raw -o image.j2k -F 512,512,3,8,u@1x1:2x2:2x2\n");
        fprintf(stderr, "         for raw 512x512 image with 4:2:0 subsampling\n");
        fprintf(stderr, "Aborting.\n");
        return NULL;
    }

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        fprintf(stderr, "Aborting\n");
        return NULL;
    }
    numcomps = raw_cp->rawComp;

    /* FIXME ADE at this point, tcp_mct has not been properly set in calling function */
    if (numcomps == 1) {
        color_space = OPJ_CLRSPC_GRAY;
    } else if ((numcomps >= 3) && (parameters->tcp_mct == 0)) {
        color_space = OPJ_CLRSPC_SYCC;
    } else if ((numcomps >= 3) && (parameters->tcp_mct != 2)) {
        color_space = OPJ_CLRSPC_SRGB;
    } else {
        color_space = OPJ_CLRSPC_UNKNOWN;
    }
    w = raw_cp->rawWidth;
    h = raw_cp->rawHeight;
    cmptparm = (opj_image_cmptparm_t*) calloc((OPJ_UINT32)numcomps,
               sizeof(opj_image_cmptparm_t));
    if (!cmptparm) {
        fprintf(stderr, "Failed to allocate image components parameters !!\n");
        fprintf(stderr, "Aborting\n");
        fclose(f);
        return NULL;
    }
    /* initialize image components */
    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)raw_cp->rawBitDepth;
        cmptparm[i].sgnd = (OPJ_UINT32)raw_cp->rawSigned;
        cmptparm[i].dx = (OPJ_UINT32)(subsampling_dx * raw_cp->rawComps[i].dx);
        cmptparm[i].dy = (OPJ_UINT32)(subsampling_dy * raw_cp->rawComps[i].dy);
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);
    free(cmptparm);
    if (!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)parameters->image_offset_x0 + (OPJ_UINT32)(w - 1) *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = (OPJ_UINT32)parameters->image_offset_y0 + (OPJ_UINT32)(h - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    if (raw_cp->rawBitDepth <= 8) {
        unsigned char value = 0;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                if (!fread(&value, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (char)value : value;
            }
        }
    } else if (raw_cp->rawBitDepth <= 16) {
        unsigned short value;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                unsigned char temp1;
                unsigned char temp2;
                if (!fread(&temp1, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&temp2, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (big_endian) {
                    value = (unsigned short)((temp1 << 8) + temp2);
                } else {
                    value = (unsigned short)((temp2 << 8) + temp1);
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (short)value : value;
            }
        }
    } else {
        fprintf(stderr,
                "OpenJPEG cannot encode raw components with bit depth higher than 16 bits.\n");
        opj_image_destroy(image);
        fclose(f);
        return NULL;
    }

    if (fread(&ch, 1, 1, f)) {
        fprintf(stderr, "Warning. End of raw file not reached... processing anyway\n");
    }
    fclose(f);

    return image;
}